

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

qint64 __thiscall QSslSocketPrivate::peek(QSslSocketPrivate *this,char *data,qint64 maxSize)

{
  char *pcVar1;
  qint64 qVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if ((this->mode == UnencryptedMode) && (this->autoStartHandshake == false)) {
    pcVar1 = *(char **)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90;
    if (pcVar1 == (char *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = QRingBuffer::peek(pcVar1,(longlong)data,maxSize);
    }
    if (maxSize != lVar3) {
      if (this->plainSocket == (QTcpSocket *)0x0) {
        maxSize = -1;
      }
      else {
        lVar4 = QIODevice::peek((char *)this->plainSocket,(longlong)(data + lVar3));
        lVar5 = lVar4;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        maxSize = lVar3 + lVar4;
        if (lVar4 < 0) {
          maxSize = lVar5;
        }
      }
    }
    return maxSize;
  }
  qVar2 = QIODevicePrivate::peek((char *)this,(longlong)data);
  return qVar2;
}

Assistant:

qint64 QSslSocketPrivate::peek(char *data, qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        qint64 r = buffer.peek(data, maxSize, transactionPos);
        if (r == maxSize)
            return r;
        data += r;
        //peek at data in the plain socket
        if (plainSocket) {
            qint64 r2 = plainSocket->peek(data, maxSize - r);
            if (r2 < 0)
                return (r > 0 ? r : r2);
            return r + r2;
        }

        return -1;
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(data, maxSize);
    }
}